

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int luaL_checkoption(lua_State *L,int idx,char *def,char **lst)

{
  int iVar1;
  char *__s2;
  long lVar2;
  
  __s2 = lua_tolstring(L,idx,(size_t *)0x0);
  if ((__s2 == (char *)0x0) && (__s2 = def, def == (char *)0x0)) {
    lj_err_argt(L,idx,4);
  }
  lVar2 = 0;
  while( true ) {
    if (lst[lVar2] == (char *)0x0) {
      lj_err_argv(L,idx,LJ_ERR_INVOPTM,__s2);
    }
    iVar1 = strcmp(lst[lVar2],__s2);
    if (iVar1 == 0) break;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

LUALIB_API int luaL_checkoption(lua_State *L, int idx, const char *def,
				const char *const lst[])
{
  ptrdiff_t i;
  const char *s = lua_tolstring(L, idx, NULL);
  if (s == NULL && (s = def) == NULL)
    lj_err_argt(L, idx, LUA_TSTRING);
  for (i = 0; lst[i]; i++)
    if (strcmp(lst[i], s) == 0)
      return (int)i;
  lj_err_argv(L, idx, LJ_ERR_INVOPTM, s);
}